

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts scalbn_decomposed(FloatParts a,int n,float_status *s)

{
  undefined4 uVar1;
  _Bool _Var2;
  uint64_t uVar3;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  float_status *s_local;
  int n_local;
  FloatParts a_local;
  undefined8 local_10;
  
  uVar3 = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_4_ = a._12_4_;
  uVar1 = a_local.frac._4_4_;
  a_local.frac._4_1_ = a.cls;
  _Var2 = is_nan(a_local.frac._4_1_);
  if (_Var2) {
    join_0x00000010_0x00000000_ = return_nan(a,s);
  }
  else {
    if (a_local.frac._4_1_ == float_class_normal) {
      local_3c = n;
      if (n < -0xffff) {
        local_3c = -0x10000;
      }
      if (local_3c < 0x10000) {
        local_40 = n;
        if (n < -0xffff) {
          local_40 = -0x10000;
        }
        local_44 = local_40;
      }
      else {
        local_44 = 0x10000;
      }
      a_local.frac._0_4_ = local_44 + (int)a_local.frac;
    }
    a_local.frac._4_1_ = (FloatClass)uVar1;
    a_local.frac._5_1_ = SUB41(uVar1,1);
    a_local.frac._6_2_ = SUB42(uVar1,2);
    local_10._4_1_ = a_local.frac._4_1_;
    local_10._5_1_ = (_Bool)a_local.frac._5_1_;
    local_10._6_2_ = a_local.frac._6_2_;
    local_10._0_4_ = (int)a_local.frac;
    a_local.exp = (int)uVar3;
    a_local.cls = (char)(uVar3 >> 0x20);
    a_local.sign = (_Bool)(char)(uVar3 >> 0x28);
    a_local._14_2_ = (short)(uVar3 >> 0x30);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts scalbn_decomposed(FloatParts a, int n, float_status *s)
{
    if (unlikely(is_nan(a.cls))) {
        return return_nan(a, s);
    }
    if (a.cls == float_class_normal) {
        /* The largest float type (even though not supported by FloatParts)
         * is float128, which has a 15 bit exponent.  Bounding N to 16 bits
         * still allows rounding to infinity, without allowing overflow
         * within the int32_t that backs FloatParts.exp.
         */
        n = MIN(MAX(n, -0x10000), 0x10000);
        a.exp += n;
    }
    return a;
}